

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.cpp
# Opt level: O2

bool __thiscall stream::chunk::operator<(chunk *this,chunk *o)

{
  compression_method cVar1;
  compression_method cVar2;
  int iVar3;
  bool bVar4;
  
  bVar4 = this->first_slice < o->first_slice;
  if (((this->first_slice == o->first_slice) &&
      (bVar4 = this->sort_offset < o->sort_offset, this->sort_offset == o->sort_offset)) &&
     (bVar4 = this->size < o->size, this->size == o->size)) {
    cVar1 = o->compression;
    cVar2 = this->compression;
    bVar4 = SBORROW4(cVar2,cVar1);
    iVar3 = cVar2 - cVar1;
    if (cVar2 == cVar1) {
      bVar4 = SBORROW4(this->encryption,o->encryption);
      iVar3 = this->encryption - o->encryption;
    }
    return bVar4 != iVar3 < 0;
  }
  return bVar4;
}

Assistant:

bool chunk::operator<(const chunk & o) const {
	
	if(first_slice != o.first_slice) {
		return (first_slice < o.first_slice);
	} else if(sort_offset != o.sort_offset) {
		return (sort_offset < o.sort_offset);
	} else if(size != o.size) {
		return (size < o.size);
	} else if(compression != o.compression) {
		return (compression < o.compression);
	} else if(encryption != o.encryption) {
		return (encryption < o.encryption);
	}
	
	return false;
}